

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

uint32_t gcd(uint32_t u,uint32_t v)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar2 = (ulong)v;
  if (u != 0) {
    if (v == 0) {
      return u;
    }
    uVar3 = v | u;
    uVar4 = 0;
    for (uVar5 = u; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x80000000) {
      uVar4 = uVar4 + 1;
    }
    uVar4 = u >> (uVar4 & 0x1f);
    do {
      uVar5 = 0;
      for (uVar1 = (uint)uVar2; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x80000000) {
        uVar5 = uVar5 + 1;
      }
      uVar1 = (uint)uVar2 >> (uVar5 & 0x1f);
      uVar5 = uVar1;
      if (uVar4 < uVar1) {
        uVar5 = uVar4;
      }
      uVar6 = (ulong)uVar4 - (ulong)uVar1;
      uVar2 = -uVar6;
      if (0 < (long)uVar6) {
        uVar2 = uVar6;
      }
      uVar4 = uVar5;
    } while ((int)uVar2 != 0);
    uVar4 = 0;
    for (; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x80000000) {
      uVar4 = uVar4 + 1;
    }
    v = uVar5 << (uVar4 & 0x1f);
  }
  return v;
}

Assistant:

uint32_t
gcd(uint32_t u, uint32_t v)
{
    int shift;
    if (u == 0) return v;
    if (v == 0) return u;
    shift = __builtin_ctz(u | v);
    u >>= __builtin_ctz(u);
    do {
        v >>= __builtin_ctz(v);
        if (u > v) {
            unsigned int t = v;
            v = u;
            u = t;
        }
        v = v - u;
    } while (v != 0);
    return u << shift;
}